

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * __thiscall
czh::utils::to_czhstr<std::__cxx11::string>
          (string *__return_storage_ptr__,utils *this,string *val,Color color)

{
  char cVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  reference local_60;
  char *r;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string ret;
  Color color_local;
  string *val_local;
  
  ret.field_2._12_4_ = SUB84(val,0);
  std::__cxx11::string::string((string *)&__range2);
  __end2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  r = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&r);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
    cVar1 = *local_60;
    if (cVar1 == '\b') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\\'
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'b')
      ;
    }
    else if (cVar1 == '\t') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\\'
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'t')
      ;
    }
    else if (cVar1 == '\n') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\\'
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'n')
      ;
    }
    else if (cVar1 == '\f') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\\'
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'f')
      ;
    }
    else if (cVar1 == '\r') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\\'
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'r')
      ;
    }
    else if (cVar1 == '\"') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\\'
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\"'
                );
    }
    else if (cVar1 == '\\') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\\'
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,'\\'
                );
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 *local_60);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  std::operator+(&local_b0,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
  std::operator+(&local_90,&local_b0,"\"");
  colorify(__return_storage_ptr__,&local_90,ret.field_2._12_4_,STR);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::string to_czhstr(const std::string &val, Color color)
  {
    std::string ret;
    for (auto &r: val)
    {
      switch (r)
      {
        case '\"':
          ret += '\\';
          ret += '\"';
          break;
        case '\\':
          ret += '\\';
          ret += '\\';
          break;
        case '\b':
          ret += '\\';
          ret += 'b';
          break;
        case '\f':
          ret += '\\';
          ret += 'f';
          break;
        case '\n':
          ret += '\\';
          ret += 'n';
          break;
        case '\r':
          ret += '\\';
          ret += 'r';
          break;
        case '\t':
          ret += '\\';
          ret += 't';
          break;
        default:
          ret += r;
          break;
      }
    }
    return colorify(("\"" + ret + "\""), color, ColorType::STR);
  }